

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstracttestlogger.cpp
# Opt level: O0

int QTest::qt_asprintf(QTestCharBuffer *str,char *format,...)

{
  bool bVar1;
  int iVar2;
  char *__s;
  char *in_RSI;
  QTestCharBuffer *in_RDI;
  long in_FS_OFFSET;
  int res;
  int size;
  va_list ap;
  undefined4 in_stack_ffffffffffffff00;
  uint in_stack_ffffffffffffff04;
  QTestCharBuffer *in_stack_ffffffffffffff08;
  int local_3c;
  undefined8 local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = QTestCharBuffer::size(in_RDI);
  do {
    local_18 = &stack0xffffffffffffff08;
    local_20 = &stack0x00000008;
    local_28 = 0x3000000010;
    __s = QTestCharBuffer::data(in_RDI);
    iVar2 = vsnprintf(__s,(long)local_3c,in_RSI,&local_28);
    if ((-1 < iVar2) && (iVar2 < local_3c)) break;
    local_3c = local_3c << 1;
    in_stack_ffffffffffffff04 = in_stack_ffffffffffffff04 & 0xffffff;
    if (local_3c < 0x200001) {
      bVar1 = QTestCharBuffer::reset
                        (in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
                         SUB41((uint)in_stack_ffffffffffffff00 >> 0x18,0));
      in_stack_ffffffffffffff04 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff04);
    }
  } while ((char)(in_stack_ffffffffffffff04 >> 0x18) != '\0');
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int qt_asprintf(QTestCharBuffer *str, const char *format, ...)
{
    Q_ASSERT(str);
    int size = str->size();
    Q_ASSERT(size > 0);

    va_list ap;
    int res = 0;

    do {
        va_start(ap, format);
        res = std::vsnprintf(str->data(), size, format, ap);
        va_end(ap);
        // vsnprintf() reliably '\0'-terminates
        Q_ASSERT(res < 0 || str->data()[res < size ? res : size - 1] == '\0');
        // Note, we're assuming that a result of -1 is always due to running out of space.
        if (res >= 0 && res < size) // Success
            break;

        // Buffer wasn't big enough, try again:
        size *= 2;
        // If too large or out of memory, take what we have:
    } while (size <= MAXSIZE && str->reset(size));

    return res;
}